

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_ALIGNRP(TT_ExecContext exc)

{
  ushort uVar1;
  FT_F26Dot6 FVar2;
  FT_F26Dot6 distance;
  FT_UShort point;
  TT_ExecContext exc_local;
  
  if ((exc->top < (exc->GS).loop) || ((exc->zp0).n_points <= (exc->GS).rp0)) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
  }
  else {
    while (0 < (exc->GS).loop) {
      exc->args = exc->args + -1;
      uVar1 = (ushort)exc->stack[exc->args];
      if (uVar1 < (exc->zp1).n_points) {
        FVar2 = (*exc->func_project)
                          (exc,(exc->zp1).cur[(int)(uint)uVar1].x -
                               (exc->zp0).cur[(int)(uint)(exc->GS).rp0].x,
                           (exc->zp1).cur[(int)(uint)uVar1].y -
                           (exc->zp0).cur[(int)(uint)(exc->GS).rp0].y);
        (*exc->func_move)(exc,&exc->zp1,uVar1,-FVar2);
      }
      else if (exc->pedantic_hinting != '\0') {
        exc->error = 0x86;
        return;
      }
      (exc->GS).loop = (exc->GS).loop + -1;
    }
  }
  (exc->GS).loop = 1;
  exc->new_top = exc->args;
  return;
}

Assistant:

static void
  Ins_ALIGNRP( TT_ExecContext  exc )
  {
    FT_UShort   point;
    FT_F26Dot6  distance;


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                               &&
         exc->ignore_x_mode                                        &&
         exc->iup_called                                           &&
         ( exc->sph_tweak_flags & SPH_TWEAK_NO_ALIGNRP_AFTER_IUP ) )
    {
      exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    if ( exc->top < exc->GS.loop                  ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    while ( exc->GS.loop > 0 )
    {
      exc->args--;

      point = (FT_UShort)exc->stack[exc->args];

      if ( BOUNDS( point, exc->zp1.n_points ) )
      {
        if ( exc->pedantic_hinting )
        {
          exc->error = FT_THROW( Invalid_Reference );
          return;
        }
      }
      else
      {
        distance = PROJECT( exc->zp1.cur + point,
                            exc->zp0.cur + exc->GS.rp0 );

        exc->func_move( exc, &exc->zp1, point, NEG_LONG( distance ) );
      }

      exc->GS.loop--;
    }

  Fail:
    exc->GS.loop = 1;
    exc->new_top = exc->args;
  }